

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall wabt::interp::Instance::Mark(Instance *this,Store *store)

{
  pointer pEVar1;
  ElemSegment *elem;
  pointer pEVar2;
  
  Store::Mark(store,(Ref)(this->module_).index);
  Store::Mark(store,&this->imports_);
  Store::Mark(store,&this->funcs_);
  Store::Mark(store,&this->memories_);
  Store::Mark(store,&this->tables_);
  Store::Mark(store,&this->globals_);
  Store::Mark(store,&this->tags_);
  Store::Mark(store,&this->exports_);
  pEVar1 = (this->elems_).
           super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (this->elems_).
                super__Vector_base<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    Store::Mark(store,&pEVar2->elements_);
  }
  return;
}

Assistant:

void Instance::Mark(Store& store) {
  store.Mark(module_);
  store.Mark(imports_);
  store.Mark(funcs_);
  store.Mark(memories_);
  store.Mark(tables_);
  store.Mark(globals_);
  store.Mark(tags_);
  store.Mark(exports_);
  for (auto&& elem : elems_) {
    elem.Mark(store);
  }
}